

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSoftBody.cpp
# Opt level: O0

void __thiscall btSoftBody::staticSolve(btSoftBody *this,int iterations)

{
  int iVar1;
  _ *p_Var2;
  psolver_t p_Var3;
  int in_ESI;
  btSoftBody *in_RDI;
  int iseq;
  int isolve;
  int local_14;
  int local_10;
  
  for (local_10 = 0; local_10 < in_ESI; local_10 = local_10 + 1) {
    local_14 = 0;
    while( true ) {
      iVar1 = btAlignedObjectArray<btSoftBody::ePSolver::_>::size(&(in_RDI->m_cfg).m_psequence);
      if (iVar1 <= local_14) break;
      p_Var2 = btAlignedObjectArray<btSoftBody::ePSolver::_>::operator[]
                         (&(in_RDI->m_cfg).m_psequence,local_14);
      p_Var3 = getSolver(*p_Var2);
      (*p_Var3)(in_RDI,1.0,0.0);
      local_14 = local_14 + 1;
    }
  }
  return;
}

Assistant:

void			btSoftBody::staticSolve(int iterations)
{
	for(int isolve=0;isolve<iterations;++isolve)
	{
		for(int iseq=0;iseq<m_cfg.m_psequence.size();++iseq)
		{
			getSolver(m_cfg.m_psequence[iseq])(this,1,0);
		}
	}
}